

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O2

bool __thiscall IceCore::Container::Delete(Container *this,udword entry)

{
  uint uVar1;
  udword *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->mCurNbEntries;
  puVar2 = this->mEntries;
  uVar3 = 0;
  do {
    uVar4 = uVar3;
    if (uVar1 == uVar4) goto LAB_001a4061;
    uVar3 = uVar4 + 1;
  } while (puVar2[uVar4] != entry);
  this->mCurNbEntries = uVar1 - 1;
  puVar2[uVar4] = puVar2[uVar1 - 1];
LAB_001a4061:
  return uVar4 < uVar1;
}

Assistant:

bool Container::Delete(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i. The strategy is to copy the last current entry at index i, and decrement the current number of entries.
			DeleteIndex(i);
			return true;
		}
	}
	return false;
}